

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O1

void __thiscall
tinyusdz::
TypedTimeSamples<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
add_sample(TypedTimeSamples<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,double t,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v)

{
  Sample s;
  undefined1 local_48 [8];
  _Alloc_hider local_40;
  size_type local_38;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_30;
  bool local_20;
  
  local_38 = 0;
  local_30._M_local_buf[0] = '\0';
  local_20 = false;
  local_48 = (undefined1  [8])t;
  local_40._M_p = (pointer)&local_30;
  ::std::__cxx11::string::_M_assign((string *)&local_40);
  ::std::
  vector<tinyusdz::TypedTimeSamples<std::__cxx11::string>::Sample,std::allocator<tinyusdz::TypedTimeSamples<std::__cxx11::string>::Sample>>
  ::emplace_back<tinyusdz::TypedTimeSamples<std::__cxx11::string>::Sample&>
            ((vector<tinyusdz::TypedTimeSamples<std::__cxx11::string>::Sample,std::allocator<tinyusdz::TypedTimeSamples<std::__cxx11::string>::Sample>>
              *)this,(Sample *)local_48);
  this->_dirty = true;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_p != &local_30) {
    operator_delete(local_40._M_p,
                    CONCAT71(local_30._M_allocated_capacity._1_7_,local_30._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void add_sample(const double t, const T &v) {
    Sample s;
    s.t = t;
    s.value = v;
    _samples.emplace_back(s);
    _dirty = true;
  }